

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O3

int Abc_CommandAbcLivenessToSafetySim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  FILE *__s;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAig;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Aig_Man_t *p;
  char *pcVar11;
  Aig_Obj_t *pAVar12;
  size_t sVar13;
  char *pcVar14;
  undefined8 *puVar15;
  Aig_Obj_t *pAVar16;
  ulong uVar17;
  Aig_Obj_t *pAVar18;
  Aig_Obj_t *pAVar19;
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar20;
  Aig_Obj_t *pAVar21;
  Aig_Obj_t *p0_00;
  Nm_Man_t *pNVar22;
  long lVar23;
  Aig_Obj_t *pAVar24;
  Aig_Obj_t *pAVar25;
  int iVar26;
  Aig_Obj_t *pAVar27;
  long lVar28;
  int local_78;
  
  pAVar6 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  if (pAVar6 == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,__s);
    return 1;
  }
  pNtk = pAVar6;
  if (pAVar6->ntkType != ABC_NTK_STRASH) {
    puts("\nThe input network was not strashed, strashing....");
    pNtk = Abc_NtkStrash(pAVar6,0,0,0);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  pVVar7 = populateLivenessVector(pAVar6,pAig);
  pVVar8 = populateFairnessVector(pAVar6,pAig);
  iVar3 = Extra_UtilGetopt(argc,argv,"1");
  uVar5 = pAig->nTruePis;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar26 = 8;
  if (6 < uVar5) {
    iVar26 = uVar5 + 1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar26;
  if (iVar3 != 0x31) {
    if (iVar26 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar26 * 8);
    }
    pVVar9->pArray = ppvVar10;
    vecPis = pVVar9;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nSize = 0;
    pVVar9->nCap = iVar26;
    if (iVar26 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar26 << 3);
    }
    pVVar9->pArray = ppvVar10;
    iVar4 = pAig->nRegs * 2 + pVVar7->nSize;
    iVar26 = pVVar8->nSize;
    vecPiNames = pVVar9;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    iVar3 = 8;
    if (6 < (uint)(iVar4 + iVar26)) {
      iVar3 = iVar26 + iVar4 + 1;
    }
    pVVar9->nSize = 0;
    pVVar9->nCap = iVar3;
    if (iVar3 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar3 * 8);
    }
    pVVar9->pArray = ppvVar10;
    vecLos = pVVar9;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nSize = 0;
    pVVar9->nCap = iVar3;
    if (iVar3 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar3 << 3);
    }
    pVVar9->pArray = ppvVar10;
    vecLoNames = pVVar9;
    p = Aig_ManStart(pAig->vObjs->nSize * 2);
    pcVar11 = (char *)malloc(10);
    builtin_strncpy(pcVar11,"live2safe",10);
    p->pName = pcVar11;
    p->pSpec = (char *)0x0;
    pAVar18 = pAig->pConst1;
    pAVar18->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    if (0 < pAig->nTruePis) {
      lVar28 = 0;
      do {
        if (pAig->vCis->nSize <= lVar28) goto LAB_006324cf;
        pAVar18 = (Aig_Obj_t *)pAig->vCis->pArray[lVar28];
        pAVar12 = Aig_ObjCreateCi(p);
        (pAVar18->field_5).pData = pAVar12;
        pVVar9 = vecPis;
        uVar5 = vecPis->nSize;
        if (uVar5 == vecPis->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecPis->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecPis->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecPis->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecPis->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecPis->pArray;
        }
        iVar26 = pVVar9->nSize;
        pVVar9->nSize = iVar26 + 1;
        ppvVar10[iVar26] = pAVar12;
        if (pAVar6->vPis->nSize <= lVar28) goto LAB_006324cf;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPis->pArray[lVar28]);
        if (pcVar11 == (char *)0x0) {
          pcVar14 = (char *)0x0;
        }
        else {
          sVar13 = strlen(pcVar11);
          pcVar14 = (char *)malloc(sVar13 + 1);
          strcpy(pcVar14,pcVar11);
        }
        pVVar9 = vecPiNames;
        uVar5 = vecPiNames->nSize;
        if (uVar5 == vecPiNames->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecPiNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecPiNames->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecPiNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecPiNames->pArray;
        }
        iVar26 = pVVar9->nSize;
        pVVar9->nSize = iVar26 + 1;
        ppvVar10[iVar26] = pcVar14;
        lVar28 = lVar28 + 1;
      } while (lVar28 < pAig->nTruePis);
    }
    pAVar12 = Aig_ObjCreateCi(p);
    puVar15 = (undefined8 *)malloc(0xb);
    *puVar15 = 0x4549425f45564153;
    *(undefined4 *)((long)puVar15 + 7) = 0x455245;
    pVVar9 = vecPiNames;
    uVar5 = vecPiNames->nSize;
    if (uVar5 == vecPiNames->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = 0x10;
      }
      else {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = uVar5 * 2;
      }
    }
    else {
      ppvVar10 = vecPiNames->pArray;
    }
    iVar26 = pVVar9->nSize;
    pVVar9->nSize = iVar26 + 1;
    ppvVar10[iVar26] = puVar15;
    if (0 < pAig->nRegs) {
      iVar26 = 0;
      do {
        uVar5 = pAig->nTruePis + iVar26;
        if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        pAVar18 = (Aig_Obj_t *)pAig->vCis->pArray[uVar5];
        pAVar16 = Aig_ObjCreateCi(p);
        (pAVar18->field_5).pData = pAVar16;
        pVVar9 = vecLos;
        uVar5 = vecLos->nSize;
        if (uVar5 == vecLos->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLos->pArray;
        }
        iVar3 = pVVar9->nSize;
        pVVar9->nSize = iVar3 + 1;
        ppvVar10[iVar3] = pAVar16;
        uVar5 = pAVar6->vPis->nSize + iVar26;
        if (((int)uVar5 < 0) || (pAVar6->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vCis->pArray[uVar5]);
        if (pcVar11 == (char *)0x0) {
          pcVar14 = (char *)0x0;
        }
        else {
          sVar13 = strlen(pcVar11);
          pcVar14 = (char *)malloc(sVar13 + 1);
          strcpy(pcVar14,pcVar11);
        }
        pVVar9 = vecLoNames;
        uVar5 = vecLoNames->nSize;
        if (uVar5 == vecLoNames->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLoNames->pArray;
        }
        iVar3 = pVVar9->nSize;
        pVVar9->nSize = iVar3 + 1;
        ppvVar10[iVar3] = pcVar14;
        iVar26 = iVar26 + 1;
      } while (iVar26 < pAig->nRegs);
    }
    pAVar16 = Aig_ObjCreateCi(p);
    pVVar9 = vecLos;
    uVar5 = vecLos->nSize;
    if (uVar5 == vecLos->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vecLos->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = 0x10;
      }
      else {
        if (vecLos->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = uVar5 * 2;
      }
    }
    else {
      ppvVar10 = vecLos->pArray;
    }
    iVar26 = pVVar9->nSize;
    pVVar9->nSize = iVar26 + 1;
    ppvVar10[iVar26] = pAVar16;
    puVar15 = (undefined8 *)malloc(9);
    *puVar15 = 0x4f4c5f4445564153;
    *(undefined1 *)(puVar15 + 1) = 0;
    pVVar9 = vecLoNames;
    uVar5 = vecLoNames->nSize;
    if (uVar5 == vecLoNames->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc(0x80);
        }
        else {
          ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = 0x10;
      }
      else {
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = uVar5 * 2;
      }
    }
    else {
      ppvVar10 = vecLoNames->pArray;
    }
    iVar26 = pVVar9->nSize;
    pVVar9->nSize = iVar26 + 1;
    ppvVar10[iVar26] = puVar15;
    pAVar24 = Aig_Or(p,pAVar12,pAVar16);
    pVVar9 = pAig->vObjs;
    if (0 < pVVar9->nSize) {
      lVar28 = 0;
      do {
        pAVar18 = (Aig_Obj_t *)pVVar9->pArray[lVar28];
        if ((pAVar18 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar18->field_0x18 & 7) - 7))
        {
          if (((ulong)pAVar18 & 1) != 0) goto LAB_0063250d;
          uVar17 = (ulong)pAVar18->pFanin0 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar27 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar27 = (Aig_Obj_t *)((ulong)((uint)pAVar18->pFanin0 & 1) ^ *(ulong *)(uVar17 + 0x28))
            ;
          }
          uVar17 = (ulong)pAVar18->pFanin1 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar25 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar25 = (Aig_Obj_t *)((ulong)((uint)pAVar18->pFanin1 & 1) ^ *(ulong *)(uVar17 + 0x28))
            ;
          }
          pAVar27 = Aig_And(p,pAVar27,pAVar25);
          (pAVar18->field_5).pData = pAVar27;
          pVVar9 = pAig->vObjs;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < pVVar9->nSize);
    }
    pAVar18 = Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                                 (((ulong)pAVar18->pFanin0 & 0xfffffffffffffffe) + 0x28));
    if (pAig->nRegs < 1) {
      local_78 = 1;
    }
    else {
      iVar26 = 0;
      do {
        local_78 = iVar26;
        iVar26 = pAig->nTruePis;
        uVar5 = local_78 + iVar26;
        if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        piVar1 = (int *)pAig->vCis->pArray[uVar5];
        if (((piVar1[6] & 7U) != 2) || (iVar3 = *piVar1, iVar3 < iVar26)) goto LAB_006324ee;
        uVar5 = (iVar3 - iVar26) + pAig->nTruePos;
        if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) goto LAB_006324cf;
        uVar17 = *(ulong *)((long)pAig->vCos->pArray[uVar5] + 8);
        Aig_ObjCreateCo(p,(Aig_Obj_t *)
                          ((ulong)((uint)uVar17 & 1) ^
                          *(ulong *)((uVar17 & 0xfffffffffffffffe) + 0x28)));
        iVar26 = local_78 + 1;
      } while (local_78 + 1 < pAig->nRegs);
      local_78 = local_78 + 2;
    }
    pAVar27 = Aig_ObjCreateCo(p,pAVar24);
    if (pAig->nRegs < 1) {
      pAVar25 = (Aig_Obj_t *)0x0;
    }
    else {
      iVar26 = 0;
      pAVar21 = (Aig_Obj_t *)0x0;
      do {
        uVar5 = pAig->nTruePis + iVar26;
        if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        pvVar2 = pAig->vCis->pArray[uVar5];
        pAVar25 = Aig_ObjCreateCi(p);
        pVVar9 = vecLos;
        uVar5 = vecLos->nSize;
        if (uVar5 == vecLos->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLos->pArray;
        }
        iVar3 = pVVar9->nSize;
        pVVar9->nSize = iVar3 + 1;
        ppvVar10[iVar3] = pAVar25;
        uVar5 = pAVar6->vPis->nSize + iVar26;
        if (((int)uVar5 < 0) || (pAVar6->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vCis->pArray[uVar5]);
        sVar13 = strlen(pcVar11);
        pcVar11 = (char *)malloc(sVar13 + 10);
        uVar5 = pAVar6->vPis->nSize + iVar26;
        if (((int)uVar5 < 0) || (pAVar6->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar14 = Abc_ObjName((Abc_Obj_t *)pAVar6->vCis->pArray[uVar5]);
        sprintf(pcVar11,"%s__%s",pcVar14,"SHADOW");
        pVVar9 = vecLoNames;
        uVar5 = vecLoNames->nSize;
        if (uVar5 == vecLoNames->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLoNames->pArray;
        }
        iVar3 = pVVar9->nSize;
        pVVar9->nSize = iVar3 + 1;
        ppvVar10[iVar3] = pcVar11;
        pAVar19 = Aig_Mux(p,pAVar12,*(Aig_Obj_t **)((long)pvVar2 + 0x28),pAVar25);
        Aig_ObjCreateCo(p,pAVar19);
        pAVar25 = Aig_Exor(p,*(Aig_Obj_t **)((long)pvVar2 + 0x28),pAVar25);
        pAVar25 = (Aig_Obj_t *)((ulong)pAVar25 ^ 1);
        if (pAVar21 != (Aig_Obj_t *)0x0) {
          pAVar25 = Aig_And(p,pAVar25,pAVar21);
        }
        iVar26 = iVar26 + 1;
        pAVar21 = pAVar25;
      } while (iVar26 < pAig->nRegs);
      local_78 = local_78 + iVar26;
    }
    pAVar25 = Aig_And(p,pAVar16,pAVar25);
    if ((pVVar7 == (Vec_Ptr_t *)0x0) || (pVVar7->nSize == 0)) {
      puts("\nCircuit without any liveness property");
LAB_00631f6e:
      lVar28 = 0;
LAB_00631f70:
      p0 = p->pConst1;
    }
    else {
      if (pVVar7->nSize < 1) goto LAB_00631f6e;
      lVar28 = 0;
      pAVar21 = (Aig_Obj_t *)0x0;
      do {
        pAVar19 = (Aig_Obj_t *)pVVar7->pArray[lVar28];
        pAVar20 = pAVar19->pFanin0;
        uVar17 = *(ulong *)(((ulong)pAVar20 & 0xfffffffffffffffe) + 0x28);
        p0 = Aig_ObjCreateCi(p);
        pVVar9 = vecLos;
        uVar5 = vecLos->nSize;
        if (uVar5 == vecLos->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLos->pArray;
        }
        iVar26 = pVVar9->nSize;
        pVVar9->nSize = iVar26 + 1;
        ppvVar10[iVar26] = p0;
        uVar5 = getPoIndex(pAig,pAVar19);
        if (((int)uVar5 < 0) || (pAVar6->vPos->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPos->pArray[uVar5]);
        sVar13 = strlen(pcVar11);
        pcVar11 = (char *)malloc(sVar13 + 0xc);
        uVar5 = getPoIndex(pAig,pAVar19);
        if (((int)uVar5 < 0) || (pAVar6->vPos->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar14 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPos->pArray[uVar5]);
        sprintf(pcVar11,"%s__%s",pcVar14,"LIVENESS");
        pVVar9 = vecLoNames;
        uVar5 = vecLoNames->nSize;
        if (uVar5 == vecLoNames->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
          }
          else {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLoNames->pArray;
        }
        iVar26 = pVVar9->nSize;
        pVVar9->nSize = iVar26 + 1;
        ppvVar10[iVar26] = pcVar11;
        pAVar19 = Aig_Mux(p,pAVar12,(Aig_Obj_t *)((ulong)p->pConst1 ^ 1),p0);
        pAVar20 = Aig_And(p,(Aig_Obj_t *)((uint)pAVar20 & 1 ^ uVar17),pAVar24);
        pAVar19 = Aig_Or(p,pAVar19,pAVar20);
        Aig_ObjCreateCo(p,pAVar19);
        if (pAVar21 != (Aig_Obj_t *)0x0) {
          p0 = Aig_And(p,p0,pAVar21);
        }
        lVar28 = lVar28 + 1;
        pAVar21 = p0;
      } while (lVar28 < pVVar7->nSize);
      local_78 = local_78 + (int)lVar28;
      if (p0 == (Aig_Obj_t *)0x0) goto LAB_00631f70;
    }
    if ((pVVar8 == (Vec_Ptr_t *)0x0) || (pVVar8->nSize == 0)) {
      puts("\nCircuit without any fairness property");
LAB_0063222f:
      lVar23 = 0;
LAB_0063223b:
      p0_00 = p->pConst1;
    }
    else {
      if (pVVar8->nSize < 1) goto LAB_0063222f;
      lVar23 = 0;
      pAVar21 = (Aig_Obj_t *)0x0;
      do {
        pAVar19 = (Aig_Obj_t *)pVVar8->pArray[lVar23];
        pAVar20 = pAVar19->pFanin0;
        uVar17 = *(ulong *)(((ulong)pAVar20 & 0xfffffffffffffffe) + 0x28);
        p0_00 = Aig_ObjCreateCi(p);
        pVVar7 = vecLos;
        uVar5 = vecLos->nSize;
        if (uVar5 == vecLos->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar7->pArray = ppvVar10;
            pVVar7->nCap = 0x10;
          }
          else {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
            }
            pVVar7->pArray = ppvVar10;
            pVVar7->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLos->pArray;
        }
        iVar26 = pVVar7->nSize;
        pVVar7->nSize = iVar26 + 1;
        ppvVar10[iVar26] = p0_00;
        uVar5 = getPoIndex(pAig,pAVar19);
        if (((int)uVar5 < 0) || (pAVar6->vPos->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPos->pArray[uVar5]);
        sVar13 = strlen(pcVar11);
        pcVar11 = (char *)malloc(sVar13 + 0xc);
        uVar5 = getPoIndex(pAig,pAVar19);
        if (((int)uVar5 < 0) || (pAVar6->vPos->nSize <= (int)uVar5)) goto LAB_006324cf;
        pcVar14 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPos->pArray[uVar5]);
        sprintf(pcVar11,"%s__%s",pcVar14,"FAIRNESS");
        pVVar7 = vecLoNames;
        uVar5 = vecLoNames->nSize;
        if (uVar5 == vecLoNames->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar7->pArray = ppvVar10;
            pVVar7->nCap = 0x10;
          }
          else {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
            }
            pVVar7->pArray = ppvVar10;
            pVVar7->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar10 = vecLoNames->pArray;
        }
        iVar26 = pVVar7->nSize;
        pVVar7->nSize = iVar26 + 1;
        ppvVar10[iVar26] = pcVar11;
        pAVar19 = Aig_Mux(p,pAVar12,(Aig_Obj_t *)((ulong)p->pConst1 ^ 1),p0_00);
        pAVar20 = Aig_And(p,(Aig_Obj_t *)((uint)pAVar20 & 1 ^ uVar17),pAVar24);
        pAVar19 = Aig_Or(p,pAVar19,pAVar20);
        Aig_ObjCreateCo(p,pAVar19);
        if (pAVar21 != (Aig_Obj_t *)0x0) {
          p0_00 = Aig_And(p,p0_00,pAVar21);
        }
        lVar23 = lVar23 + 1;
        pAVar21 = p0_00;
      } while (lVar23 < pVVar8->nSize);
      local_78 = local_78 + (int)lVar23;
      if (p0_00 == (Aig_Obj_t *)0x0) goto LAB_0063223b;
    }
    pAVar12 = Aig_And(p,p0_00,(Aig_Obj_t *)((ulong)p0 ^ 1));
    pAVar12 = Aig_And(p,pAVar25,pAVar12);
    Aig_ObjPatchFanin0(p,pAVar18,pAVar12);
    Aig_ManSetRegNum(p,local_78);
    iVar26 = p->vCis->nSize;
    p->nObjs[2] = iVar26;
    iVar3 = p->nRegs;
    if (iVar3 == 0) {
      iVar26 = p->vCos->nSize;
    }
    else {
      p->nTruePis = iVar26 - iVar3;
      iVar26 = p->vCos->nSize;
      p->nTruePos = iVar26 - iVar3;
    }
    p->nObjs[3] = iVar26;
    Aig_ManCleanup(p);
    iVar26 = Aig_ManCheck(p);
    if (iVar26 == 0) {
      __assert_fail("Aig_ManCheck( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                    ,0x1d3,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (0xfffffffd < (*(uint *)&pAVar16->field_0x18 & 7) - 7) {
      __assert_fail("!Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
    }
    uVar5 = ~pAig->nTruePis + (pAVar16->field_0).CioId + p->nTruePos;
    if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar5)) {
LAB_006324cf:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Aig_Obj_t *)p->vCos->pArray[uVar5] != pAVar27) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                    ,0x1d6,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePos != 1) {
      __assert_fail("Saig_ManPoNum( pNew ) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                    ,0x1d7,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (pAig->nTruePis + 1U != p->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                    ,0x1d8,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nRegs != (int)lVar28 + (int)lVar23 + pAig->nRegs * 2 + 1) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                    ,0x1d9,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    goto LAB_00632354;
  }
  if (iVar26 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar26 << 3);
  }
  pVVar9->pArray = ppvVar10;
  vecPis = pVVar9;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar26;
  if (iVar26 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar26 << 3);
  }
  pVVar9->pArray = ppvVar10;
  iVar4 = pAig->nRegs * 2 + pVVar7->nSize;
  iVar26 = pVVar8->nSize;
  vecPiNames = pVVar9;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < (uint)(iVar4 + iVar26)) {
    iVar3 = iVar26 + iVar4 + 1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar3 * 8);
  }
  pVVar9->pArray = ppvVar10;
  vecLos = pVVar9;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar3 << 3);
  }
  pVVar9->pArray = ppvVar10;
  vecLoNames = pVVar9;
  p = Aig_ManStart(pAig->vObjs->nSize * 2);
  pcVar11 = (char *)malloc(10);
  builtin_strncpy(pcVar11,"live2safe",10);
  p->pName = pcVar11;
  p->pSpec = (char *)0x0;
  pAVar18 = pAig->pConst1;
  pAVar18->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar28 = 0;
    do {
      if (pAig->vCis->nSize <= lVar28) goto LAB_006324cf;
      pAVar18 = (Aig_Obj_t *)pAig->vCis->pArray[lVar28];
      pAVar12 = Aig_ObjCreateCi(p);
      (pAVar18->field_5).pData = pAVar12;
      pVVar9 = vecPis;
      uVar5 = vecPis->nSize;
      if (uVar5 == vecPis->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
        }
        else {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vecPis->pArray,(ulong)uVar5 << 4);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar10 = vecPis->pArray;
      }
      iVar26 = pVVar9->nSize;
      pVVar9->nSize = iVar26 + 1;
      ppvVar10[iVar26] = pAVar12;
      if (pAVar6->vPis->nSize <= lVar28) goto LAB_006324cf;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vPis->pArray[lVar28]);
      if (pcVar11 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      else {
        sVar13 = strlen(pcVar11);
        pcVar14 = (char *)malloc(sVar13 + 1);
        strcpy(pcVar14,pcVar11);
      }
      pVVar9 = vecPiNames;
      uVar5 = vecPiNames->nSize;
      if (uVar5 == vecPiNames->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
        }
        else {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar10 = vecPiNames->pArray;
      }
      iVar26 = pVVar9->nSize;
      pVVar9->nSize = iVar26 + 1;
      ppvVar10[iVar26] = pcVar14;
      lVar28 = lVar28 + 1;
    } while (lVar28 < pAig->nTruePis);
  }
  pAVar12 = Aig_ObjCreateCi(p);
  pVVar9 = vecPiNames;
  uVar5 = vecPiNames->nSize;
  if (uVar5 == vecPiNames->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vecPiNames->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(vecPiNames->pArray,0x80);
      }
      pVVar9->pArray = ppvVar10;
      pVVar9->nCap = 0x10;
    }
    else {
      if (vecPiNames->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
      }
      pVVar9->pArray = ppvVar10;
      pVVar9->nCap = uVar5 * 2;
    }
  }
  else {
    ppvVar10 = vecPiNames->pArray;
  }
  iVar26 = pVVar9->nSize;
  pVVar9->nSize = iVar26 + 1;
  ppvVar10[iVar26] = "SAVE_BIERE";
  if (0 < pAig->nRegs) {
    iVar26 = 0;
    do {
      uVar5 = pAig->nTruePis + iVar26;
      if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
      pAVar18 = (Aig_Obj_t *)pAig->vCis->pArray[uVar5];
      pAVar16 = Aig_ObjCreateCi(p);
      (pAVar18->field_5).pData = pAVar16;
      pVVar9 = vecLos;
      uVar5 = vecLos->nSize;
      if (uVar5 == vecLos->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
        }
        else {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar10 = vecLos->pArray;
      }
      iVar3 = pVVar9->nSize;
      pVVar9->nSize = iVar3 + 1;
      ppvVar10[iVar3] = pAVar16;
      uVar5 = pAVar6->vPis->nSize + iVar26;
      if (((int)uVar5 < 0) || (pAVar6->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pAVar6->vCis->pArray[uVar5]);
      if (pcVar11 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      else {
        sVar13 = strlen(pcVar11);
        pcVar14 = (char *)malloc(sVar13 + 1);
        strcpy(pcVar14,pcVar11);
      }
      pVVar9 = vecLoNames;
      uVar5 = vecLoNames->nSize;
      if (uVar5 == vecLoNames->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
        }
        else {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar10 = vecLoNames->pArray;
      }
      iVar3 = pVVar9->nSize;
      pVVar9->nSize = iVar3 + 1;
      ppvVar10[iVar3] = pcVar14;
      iVar26 = iVar26 + 1;
    } while (iVar26 < pAig->nRegs);
  }
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar28 = 0;
    do {
      pAVar18 = (Aig_Obj_t *)pVVar9->pArray[lVar28];
      if ((pAVar18 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar18->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar18 & 1) != 0) {
LAB_0063250d:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar17 = (ulong)pAVar18->pFanin0 & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = (Aig_Obj_t *)((ulong)((uint)pAVar18->pFanin0 & 1) ^ *(ulong *)(uVar17 + 0x28));
        }
        uVar17 = (ulong)pAVar18->pFanin1 & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar24 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar24 = (Aig_Obj_t *)((ulong)((uint)pAVar18->pFanin1 & 1) ^ *(ulong *)(uVar17 + 0x28));
        }
        pAVar16 = Aig_And(p,pAVar16,pAVar24);
        (pAVar18->field_5).pData = pAVar16;
        pVVar9 = pAig->vObjs;
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < pVVar9->nSize);
  }
  pAVar18 = Aig_ObjCreateCo(p,*(Aig_Obj_t **)(((ulong)pAVar18->pFanin0 & 0xfffffffffffffffe) + 0x28)
                           );
  if (pAig->nRegs < 1) {
    iVar26 = 0;
LAB_006313e9:
    pAVar16 = (Aig_Obj_t *)0x0;
  }
  else {
    iVar26 = 0;
    do {
      iVar3 = pAig->nTruePis;
      uVar5 = iVar26 + iVar3;
      if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
      piVar1 = (int *)pAig->vCis->pArray[uVar5];
      if (((piVar1[6] & 7U) != 2) || (iVar4 = *piVar1, iVar4 < iVar3)) goto LAB_006324ee;
      uVar5 = (iVar4 - iVar3) + pAig->nTruePos;
      if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) goto LAB_006324cf;
      uVar17 = *(ulong *)((long)pAig->vCos->pArray[uVar5] + 8);
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)((uint)uVar17 & 1) ^
                        *(ulong *)((uVar17 & 0xfffffffffffffffe) + 0x28)));
      iVar26 = iVar26 + 1;
    } while (iVar26 < pAig->nRegs);
    iVar3 = 0;
    if (pAig->nRegs < 1) goto LAB_006313e9;
    pAVar24 = (Aig_Obj_t *)0x0;
    do {
      iVar4 = pAig->nTruePis;
      uVar5 = iVar3 + iVar4;
      if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_006324cf;
      piVar1 = (int *)pAig->vCis->pArray[uVar5];
      if (((piVar1[6] & 7U) != 2) || (*piVar1 < iVar4)) {
LAB_006324ee:
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar5 = (*piVar1 - iVar4) + pAig->nTruePos;
      if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) goto LAB_006324cf;
      uVar17 = *(ulong *)((long)pAig->vCos->pArray[uVar5] + 8);
      pAVar16 = Aig_Exor(p,*(Aig_Obj_t **)(piVar1 + 10),
                         (Aig_Obj_t *)
                         ((ulong)((uint)uVar17 & 1) ^
                         *(ulong *)((uVar17 & 0xfffffffffffffffe) + 0x28)));
      pAVar16 = (Aig_Obj_t *)((ulong)pAVar16 ^ 1);
      if (pAVar24 != (Aig_Obj_t *)0x0) {
        pAVar16 = Aig_And(p,pAVar16,pAVar24);
      }
      iVar3 = iVar3 + 1;
      pAVar24 = pAVar16;
    } while (iVar3 < pAig->nRegs);
  }
  pAVar12 = Aig_And(p,pAVar12,pAVar16);
  if ((pVVar7 == (Vec_Ptr_t *)0x0) || (iVar3 = pVVar7->nSize, iVar3 == 0)) {
    puts("\nCircuit without any liveness property");
LAB_0063147d:
    pAVar24 = p->pConst1;
  }
  else {
    if (iVar3 < 1) goto LAB_0063147d;
    lVar28 = 0;
    pAVar16 = (Aig_Obj_t *)0x0;
    do {
      uVar17 = *(ulong *)((long)pVVar7->pArray[lVar28] + 8);
      pAVar24 = (Aig_Obj_t *)
                ((ulong)((uint)uVar17 & 1) ^ *(ulong *)((uVar17 & 0xfffffffffffffffe) + 0x28));
      if (pAVar16 != (Aig_Obj_t *)0x0) {
        pAVar24 = Aig_And(p,pAVar24,pAVar16);
        iVar3 = pVVar7->nSize;
      }
      lVar28 = lVar28 + 1;
      pAVar16 = pAVar24;
    } while (lVar28 < iVar3);
    if (pAVar24 == (Aig_Obj_t *)0x0) goto LAB_0063147d;
  }
  if ((pVVar8 == (Vec_Ptr_t *)0x0) || (iVar3 = pVVar8->nSize, iVar3 == 0)) {
    puts("\nCircuit without any fairness property");
LAB_006314f3:
    pAVar27 = p->pConst1;
  }
  else {
    if (iVar3 < 1) goto LAB_006314f3;
    lVar28 = 0;
    pAVar16 = (Aig_Obj_t *)0x0;
    do {
      uVar17 = *(ulong *)((long)pVVar8->pArray[lVar28] + 8);
      pAVar27 = (Aig_Obj_t *)
                ((ulong)((uint)uVar17 & 1) ^ *(ulong *)((uVar17 & 0xfffffffffffffffe) + 0x28));
      if (pAVar16 != (Aig_Obj_t *)0x0) {
        pAVar27 = Aig_And(p,pAVar27,pAVar16);
        iVar3 = pVVar8->nSize;
      }
      lVar28 = lVar28 + 1;
      pAVar16 = pAVar27;
    } while (lVar28 < iVar3);
    if (pAVar27 == (Aig_Obj_t *)0x0) goto LAB_006314f3;
  }
  pAVar16 = Aig_And(p,pAVar27,(Aig_Obj_t *)((ulong)pAVar24 ^ 1));
  pAVar12 = Aig_And(p,pAVar12,pAVar16);
  Aig_ObjPatchFanin0(p,pAVar18,pAVar12);
  Aig_ManSetRegNum(p,iVar26);
  printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n",
         (ulong)(uint)p->vCis->nSize,(ulong)(uint)p->nRegs);
  iVar26 = p->vCis->nSize;
  p->nObjs[2] = iVar26;
  iVar3 = p->nRegs;
  if (iVar3 == 0) {
    iVar26 = p->vCos->nSize;
  }
  else {
    p->nTruePis = iVar26 - iVar3;
    iVar26 = p->vCos->nSize;
    p->nTruePos = iVar26 - iVar3;
  }
  p->nObjs[3] = iVar26;
  Aig_ManCleanup(p);
  iVar26 = Aig_ManCheck(p);
  if (iVar26 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness_sim.c"
                  ,0x2b3,
                  "Aig_Man_t *LivenessToSafetyTransformationOneStepLoopSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
LAB_00632354:
  pAVar6 = Abc_NtkFromAigPhase(p);
  iVar26 = Abc_NtkCheck(pAVar6);
  if (iVar26 == 0) {
    fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
  }
  pVVar8 = vecLoNames;
  pVVar7 = vecPiNames;
  pNVar22 = Nm_ManCreate(pAVar6->vCis->nSize);
  pAVar6->pManName = pNVar22;
  if (0 < p->nTruePis) {
    lVar28 = 0;
    do {
      if (((p->vCis->nSize <= lVar28) || (pAVar6->vCis->nSize <= lVar28)) ||
         (pVVar7->nSize <= lVar28)) goto LAB_006324cf;
      Nm_ManStoreIdName(pAVar6->pManName,*(int *)((long)pAVar6->vCis->pArray[lVar28] + 0x10),
                        *(uint *)((long)p->vCis->pArray[lVar28] + 0x18) & 7,
                        (char *)pVVar7->pArray[lVar28],(char *)0x0);
      lVar28 = lVar28 + 1;
    } while (lVar28 < p->nTruePis);
  }
  if (0 < p->nRegs) {
    lVar28 = 0;
    do {
      uVar17 = (ulong)(uint)p->nTruePis + lVar28;
      iVar26 = (int)uVar17;
      if (((iVar26 < 0) || (p->vCis->nSize <= iVar26)) ||
         ((pAVar6->vCis->nSize <= iVar26 || (pVVar8->nSize <= lVar28)))) goto LAB_006324cf;
      uVar17 = uVar17 & 0xffffffff;
      Nm_ManStoreIdName(pAVar6->pManName,*(int *)((long)pAVar6->vCis->pArray[uVar17] + 0x10),
                        *(uint *)((long)p->vCis->pArray[uVar17] + 0x18) & 7,
                        (char *)pVVar8->pArray[lVar28],(char *)0x0);
      lVar28 = lVar28 + 1;
    } while (lVar28 < p->nRegs);
  }
  Abc_FrameSetCurrentNetwork(pAbc,pAVar6);
  return 0;
}

Assistant:

int Abc_CommandAbcLivenessToSafetySim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkNew, *pNtkOld;
    Aig_Man_t * pAig, *pAigNew;
    int c;
    Vec_Ptr_t * vLive, * vFair;
                
    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }

    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("\nThe input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkOld = pNtkTemp;
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkOld = pNtk;
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }

#if 0
    Aig_ManPrintStats( pAig );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAig ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAig ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAig ) - Saig_ManPiNum( pAig ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAig ) - Saig_ManPoNum( pAig ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAig ) );
    printf("\n*******************************************************\n");
#endif

    c = Extra_UtilGetopt( argc, argv, "1" );
    if( c == '1' )
        pAigNew = LivenessToSafetyTransformationOneStepLoopSim( pNtk, pAig, vLive, vFair );
    else
        pAigNew = LivenessToSafetyTransformationSim( pNtk, pAig, vLive, vFair );
    
#if 0
    Aig_ManPrintStats( pAigNew );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAigNew ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAigNew ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAigNew ) - Saig_ManPiNum( pAigNew ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAigNew ) - Saig_ManPoNum( pAigNew ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAigNew ) );
    printf("\n*******************************************************\n");
#endif

    pNtkNew = Abc_NtkFromAigPhase( pAigNew );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    
    updateNewNetworkNameManager( pNtkNew, pAigNew, vecPiNames,vecLoNames );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkNew );

    //Saig_ManForEachPi( pAigNew, pObj, i )
    //    printf("Name of %d-th Pi = %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) );

    //Saig_ManForEachLo( pAigNew, pObj, i )
    //    printf("Name of %d-th Lo = %s\n", i, retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) );

    //printVecPtrOfString( vecPiNames );
    //printVecPtrOfString( vecLoNames );

#if 0
#ifndef DUPLICATE_CKT_DEBUG
    Saig_ManForEachPi( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecPiNames, i), retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) ) == 0 );
        //printf("Name of %d-th Pi = %s, %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ), (char *)Vec_PtrEntry(vecPiNames, i) );

    Saig_ManForEachLo( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecLoNames, i), retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) ) == 0 );
#endif    
#endif
        
    return 0;

}